

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_storage_iface.hpp
# Opt level: O0

void __thiscall
so_5::impl::subscription_storage_common::subscr_info_t::subscr_info_t
          (subscr_info_t *this,mbox_t *mbox,type_index msg_type,state_t *state,
          event_handler_method_t *method,thread_safety_t thread_safety)

{
  function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)> local_58;
  thread_safety_t local_31;
  event_handler_method_t *peStack_30;
  thread_safety_t thread_safety_local;
  event_handler_method_t *method_local;
  state_t *state_local;
  mbox_t *mbox_local;
  subscr_info_t *this_local;
  type_index msg_type_local;
  
  local_31 = thread_safety;
  peStack_30 = method;
  method_local = (event_handler_method_t *)state;
  state_local = (state_t *)mbox;
  mbox_local = &this->m_mbox;
  this_local = (subscr_info_t *)msg_type._M_target;
  intrusive_ptr_t<so_5::abstract_message_box_t>::intrusive_ptr_t(&this->m_mbox,mbox);
  (this->m_msg_type)._M_target = (type_info *)this_local;
  this->m_state = (state_t *)method_local;
  std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::function
            (&local_58,peStack_30);
  event_handler_data_t::event_handler_data_t(&this->m_handler,&local_58,local_31);
  std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::~function
            (&local_58);
  return;
}

Assistant:

subscr_info_t(
			mbox_t mbox,
			std::type_index msg_type,
			const state_t & state,
			const event_handler_method_t & method,
			thread_safety_t thread_safety )
			:	m_mbox( std::move( mbox ) )
			,	m_msg_type( std::move( msg_type ) )
			,	m_state( &state )
			,	m_handler( method, thread_safety )
			{}